

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O3

int escaped_string_length(char *str)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  
  if (str == (char *)0x0) {
    return 0;
  }
  iVar3 = 0;
  iVar1 = 0;
  do {
    if (str[iVar3] == '\\') {
      iVar2 = iVar3 + 1;
      uVar4 = (byte)str[(long)iVar3 + 1] - 0x5c;
      if ((0x1a < uVar4) || ((0x5440661U >> (uVar4 & 0x1f) & 1) == 0)) {
        if ((byte)(str[(long)iVar3 + 1] - 0x3aU) < 0xf6) {
          return -1;
        }
        if ((byte)(str[(long)iVar3 + 2] - 0x30U) < 10) {
          iVar2 = 3;
          if (9 < (byte)(str[(long)iVar3 + 3] - 0x30U)) {
            iVar2 = 2;
          }
          iVar2 = iVar3 + iVar2;
        }
      }
    }
    else {
      iVar2 = iVar3;
      if (str[iVar3] == '\0') {
        return iVar1;
      }
    }
    iVar1 = iVar1 + 1;
    iVar3 = iVar2 + 1;
  } while( true );
}

Assistant:

static int escaped_string_length(char *str)
{
    int from;
    int to;

    if (str == NULL)
    {
        return 0;
    }

    from = 0;
    to = 0;

    while (str[from] != '\0')
    {
        if (str[from] == '\\')
        {
            from++;
            switch (str[from])
            {
                case 'e':
                case 'a':
                case 'b':
                case 'f':
                case 'n':
                case 'r':
                case 't':
                case 'v':
                case '\\':
                    to++;
                    break;
                default:
                    if (str[from] < '0' || str[from] > '9')
                    {
                        return -1;
                    }
                    if (str[from + 1] >= '0' && str[from + 1] <= '9')
                    {
                        from++;
                        if (str[from + 1] >= '0' && str[from + 1] <= '9')
                        {
                            from++;
                        }
                    }
                    to++;
            }
        }
        else
        {
            to++;
        }
        from++;
    }

    return to;
}